

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_a.h
# Opt level: O2

void pre_reentrancy(tsd_t *tsd,arena_t *arena)

{
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
       tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
  if ((tsd->state).repr != '\0') {
    return;
  }
  tsd_slow_update(tsd);
  return;
}

Assistant:

static inline void
pre_reentrancy(tsd_t *tsd, arena_t *arena) {
	/* arena is the current context.  Reentry from a0 is not allowed. */
	assert(arena != arena_get(tsd_tsdn(tsd), 0, false));

	bool fast = tsd_fast(tsd);
	assert(tsd_reentrancy_level_get(tsd) < INT8_MAX);
	++*tsd_reentrancy_levelp_get(tsd);
	if (fast) {
		/* Prepare slow path for reentrancy. */
		tsd_slow_update(tsd);
		assert(tsd_state_get(tsd) == tsd_state_nominal_slow);
	}
}